

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

string * __thiscall
helics::apps::TemplateMatcher::instantiateTemplate_abi_cxx11_
          (string *__return_storage_ptr__,TemplateMatcher *this,size_t index)

{
  _Alloc_hider *p_Var1;
  pointer pbVar2;
  pointer pcVar3;
  pointer pdVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  
  if (index < (this->combinations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]) {
    pbVar2 = (this->intermediaries).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + pbVar2->_M_string_length);
    lVar11 = 5;
    lVar10 = 5;
    for (uVar7 = 0;
        pdVar4 = (this->keys).
                 super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar7 < (ulong)(((long)(this->keys).
                               super__Vector_base<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar4 >> 4) *
                       -0x3333333333333333); uVar7 = uVar7 + 1) {
      uVar8 = (this->combinations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar7];
      uVar6 = index / uVar8;
      index = index % uVar8;
      lVar5 = *(long *)((long)pdVar4 + lVar10 * 8 + -0x18);
      uVar8 = (lVar5 - *(long *)((long)pdVar4 + lVar10 * 8 + -0x10) >> 5) + uVar6;
      if (uVar8 < 0x10) {
        puVar9 = (undefined8 *)(lVar5 + uVar6 * 0x20);
      }
      else {
        uVar6 = (uVar8 >> 4) + 0xf000000000000000;
        if (0 < (long)uVar8) {
          uVar6 = uVar8 >> 4;
        }
        puVar9 = (undefined8 *)
                 ((uVar8 + uVar6 * -0x10) * 0x20 +
                 *(long *)(*(long *)((long)&(pdVar4->
                                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Deque_impl_data + lVar10 * 8) +
                          uVar6 * 8));
      }
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append(__return_storage_ptr__,(char *)*puVar9,puVar9[1]);
      pbVar2 = (this->intermediaries).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar11 * 8;
      p_Var1 = &pbVar2->_M_dataplus + lVar11;
      lVar10 = lVar10 + 10;
      lVar11 = lVar11 + 4;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_append(__return_storage_ptr__,*(char **)((long)pbVar2 + lVar5 + -8),(size_type)p_Var1->_M_p
               );
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TemplateMatcher::instantiateTemplate(std::size_t index)
{
    if (index >= combinations.back()) {
        return {};
    }
    std::string rval = intermediaries.front();
    for (std::size_t ii = 0; ii < keys.size(); ++ii) {
        const std::size_t subIndex = index / combinations[ii];
        index = index % combinations[ii];
        rval.append(keys[ii][subIndex]);
        rval.append(intermediaries[ii + 1]);
    }
    return rval;
}